

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O1

QByteArray * __thiscall Parser::lexem(QByteArray *__return_storage_ptr__,Parser *this)

{
  Symbol *pSVar1;
  long lVar2;
  
  pSVar1 = (this->symbols).d.ptr;
  lVar2 = this->index;
  QByteArray::mid(__return_storage_ptr__,&pSVar1[lVar2 + -1].lex,pSVar1[lVar2 + -1].from,
                  pSVar1[lVar2 + -1].len);
  return __return_storage_ptr__;
}

Assistant:

inline QByteArray lexem() { return symbols.at(index-1).lexem();}